

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O2

xformDatabase * initXformDB(void)

{
  xformDatabase *xdb;
  transformData *ptVar1;
  long lVar2;
  
  xdb = (xformDatabase *)malloc(0xb8);
  if (xdb == (xformDatabase *)0x0) {
    warn("could not create transformation database");
  }
  else {
    ptVar1 = (transformData *)malloc(0x400);
    if (ptVar1 != (transformData *)0x0) {
      xdb->xforms = (transformData *)0x0;
      xdb->last = (transformData *)0x0;
      xdb->nlevs = 0;
      for (lVar2 = 3; lVar2 != 0xb; lVar2 = lVar2 + 1) {
        xdb->level[lVar2 + -3] = (transformData *)0x0;
      }
      xdb->nstack = 0;
      for (lVar2 = 0xc; lVar2 != 0x14; lVar2 = lVar2 + 1) {
        xdb->level[lVar2 + -3] = ptVar1;
        ptVar1 = (transformData *)&ptVar1->tmat;
      }
      initializeXFStack(xdb);
      xdb->golist = (goToRec *)0x0;
      xdb->glast = (goToRec *)0x0;
      xdb->sortedByRes = (xformAtomRecords **)0x0;
      return xdb;
    }
    warn("could not create transformation stack");
    free(xdb);
  }
  return (xformDatabase *)0x0;
}

Assistant:

xformDatabase* initXformDB() {
   xformDatabase *xdb = NULL;
   matrix4 *mp = NULL;
   int i = 0;

   xdb = (xformDatabase *)malloc(sizeof(xformDatabase));
   if (!xdb) {
      warn("could not create transformation database");
      return NULL;
   }

   mp = (matrix4*)malloc(sizeof(matrix4)*MAX_XFORM_STACK_DEPTH);
   if (!mp) {
      warn("could not create transformation stack");
      if (xdb) { free(xdb); }
      return NULL;
   }

   xdb->xforms = xdb->last = NULL;

   xdb->nlevs = 0;
   for(i = 0; i < MAX_XFORM_LEVELS; i++) {
      xdb->level[i] = NULL;
   }

   xdb->nstack = 0;
   for(i = 0; i < MAX_XFORM_STACK_DEPTH; i++) {
      xdb->ctmstack[i] = &(mp[i]);
   }
   initializeXFStack(xdb);

   xdb->golist = xdb->glast = NULL;

   xdb->sortedByRes = NULL;

   return xdb;
}